

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmt_aliases.h
# Opt level: O2

bool date::
     read_impl<date::iterator_proxy<std::istreambuf_iterator<char,std::char_traits<char>>>,char,4ul,unsigned_char,7ul,date::characters_t<char,3ul>&>
               (iterator_proxy<std::istreambuf_iterator<char,_std::char_traits<char>_>_> *pos,
               iterator_proxy<std::istreambuf_iterator<char,_std::char_traits<char>_>_> *end,
               aliases_t<char,_4UL,_unsigned_char,_7UL> *fmt,characters_t<char,_3UL> *others)

{
  char cVar1;
  char *pcVar2;
  bool bVar3;
  pair<date::static_string<char,_4UL>,_unsigned_char> *ppVar4;
  long lVar5;
  long lVar6;
  size_t i;
  ulong uVar7;
  array<bool,_7UL> is_match;
  array<const_char_*,_7UL> str_list;
  
  ppVar4 = fmt->aliases->_M_elems;
  for (lVar5 = 0; lVar5 != 7; lVar5 = lVar5 + 1) {
    str_list._M_elems[lVar5] = (char *)ppVar4;
    is_match._M_elems[lVar5] =
         (((pair<date::static_string<char,_4UL>,_unsigned_char> *)&ppVar4->first)->first).m_length
         != 0;
    ppVar4 = ppVar4 + 1;
  }
  uVar7 = 0;
  while ((uVar7 != 4 && (end->m_position != pos->m_position))) {
    cVar1 = pos->m_cache[pos->m_position];
    lVar6 = 0;
    for (lVar5 = 2; lVar5 != 0x17; lVar5 = lVar5 + 3) {
      if (is_match._M_elems[lVar6] == true) {
        pcVar2 = str_list._M_elems[lVar6];
        if (*pcVar2 == cVar1) {
          if (pcVar2[1] == '\0') {
            iterator_proxy<std::istreambuf_iterator<char,_std::char_traits<char>_>_>::operator++
                      (pos);
            *fmt->value = (&fmt->aliases->_M_elems[0].first.m_data)[lVar5 * 2]._M_elems[0];
            bVar3 = read_impl<date::iterator_proxy<std::istreambuf_iterator<char,std::char_traits<char>>>,char,3ul>
                              (pos,end,others);
            goto LAB_001097b2;
          }
          str_list._M_elems[lVar6] = pcVar2 + 1;
        }
        else {
          is_match._M_elems[lVar6] = false;
        }
      }
      lVar6 = lVar6 + 1;
    }
    uVar7 = uVar7 + 1;
    iterator_proxy<std::istreambuf_iterator<char,_std::char_traits<char>_>_>::operator++(pos);
  }
  bVar3 = false;
LAB_001097b2:
  return (bool)(uVar7 < 4 & bVar3);
}

Assistant:

bool read_impl(Iterator& pos, const Iterator& end, aliases_t<Char, Length, Value, Count>& fmt, Others&&... others)
{
    using char_type = typename iterator_traits<Iterator>::value_type;

    std::array<const Char*, Count> str_list;
    std::array<bool, Count> is_match;
    for (std::size_t k = 0; k < Count; ++k)
    {
        const auto& str = fmt.aliases[k].first;
        str_list[k] = str.c_str();
        is_match[k] = !str.empty();
    }

    for (std::size_t i = 0; i < Length; ++i, ++pos)
    {
        if (pos == end)
            return false;

        const char_type ch = *pos;
        for (std::size_t k = 0; k < Count; ++k)
        {
            if (!is_match[k])
                continue;
            
            const Char* str = str_list[k];
            if (*str != ch)
            {
                is_match[k] = false;
                continue;
            }

            ++str;
            if (*str != Char{ '\0' })
            {
                str_list[k] = str;
                continue;
            }

            ++pos;
            fmt.value = fmt.aliases[k].second;
            return read_impl(pos, end, std::forward<Others>(others)...);
        }
    }

    return false;
}